

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O2

int it_riff_am_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len,int ver)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  int32 iVar4;
  uint uVar5;
  int iVar6;
  IT_ENTRY *entry;
  long lVar7;
  IT_ENTRY *pIVar8;
  long lVar9;
  int iVar10;
  IT_ENTRY *pIVar11;
  IT_ENTRY *pIVar12;
  
  iVar1 = dumbfile_getc(f);
  pattern->n_rows = iVar1 + 1;
  pattern->n_entries = 0;
  iVar2 = dumbfile_pos(f);
  lVar9 = (long)len + (long)iVar2 + -1;
  for (iVar10 = 0; iVar10 <= iVar1; iVar10 = iVar10 + 1) {
    while( true ) {
      iVar3 = dumbfile_error(f);
      if ((iVar3 != 0) || (iVar4 = dumbfile_pos(f), lVar9 <= iVar4)) goto LAB_0057e650;
      uVar5 = dumbfile_getc(f);
      if (uVar5 == 0) break;
      if ((uVar5 & 0xe0) != 0) {
        pattern->n_entries = pattern->n_entries + 1;
        if ((char)uVar5 < '\0') {
          dumbfile_skip(f,2);
        }
        if ((uVar5 & 0x40) != 0) {
          dumbfile_skip(f,2);
        }
        if ((uVar5 & 0x20) != 0) {
          dumbfile_skip(f,1);
        }
      }
    }
  }
LAB_0057e650:
  if (pattern->n_entries == 0) {
    iVar1 = 0;
  }
  else {
    iVar10 = pattern->n_entries + iVar1 + 1;
    pattern->n_entries = iVar10;
    entry = (IT_ENTRY *)malloc((long)iVar10 * 7);
    pattern->entry = entry;
    if (entry == (IT_ENTRY *)0x0) {
      iVar1 = -1;
    }
    else {
      dumbfile_seek(f,(long)iVar2,0);
      iVar10 = 0;
      pIVar11 = entry;
      while (((pIVar8 = pIVar11, pIVar12 = pIVar11, iVar10 <= iVar1 &&
              (iVar3 = dumbfile_error(f), pIVar8 = entry, pIVar12 = entry, iVar3 == 0)) &&
             (iVar2 = dumbfile_pos(f), iVar2 < lVar9))) {
        uVar5 = dumbfile_getc(f);
        if (uVar5 == 0) {
          entry->channel = 0xff;
          entry = entry + 1;
          iVar10 = iVar10 + 1;
          pIVar11 = entry;
        }
        else {
          entry->channel = (byte)uVar5 & 0x1f;
          entry->mask = '\0';
          if ((uVar5 & 0xe0) != 0) {
            if ((char)(byte)uVar5 < '\0') {
              iVar3 = dumbfile_getc(f);
              iVar6 = dumbfile_getc(f);
              _dumb_it_xm_convert_effect(iVar6,iVar3,entry,0);
            }
            if ((uVar5 & 0x40) != 0) {
              iVar3 = dumbfile_getc(f);
              iVar6 = dumbfile_getc(f);
              if (iVar3 != 0) {
                entry->mask = entry->mask | 2;
                entry->instrument = (uchar)iVar3;
              }
              if (iVar6 != 0) {
                entry->mask = entry->mask | 1;
                entry->note = (char)iVar6 + 0xff;
              }
            }
            if ((uVar5 & 0x20) == 0) {
              lVar7 = 7;
              if (entry->mask == '\0') {
                lVar7 = 0;
              }
            }
            else {
              iVar3 = dumbfile_getc(f);
              entry->mask = entry->mask | 4;
              if (ver != 0) {
                iVar3 = (iVar3 << 6) / 0x7f;
              }
              entry->volpan = (uchar)iVar3;
              lVar7 = 7;
            }
            entry = (IT_ENTRY *)(&entry->channel + lVar7);
          }
        }
      }
      for (; iVar10 <= iVar1; iVar10 = iVar10 + 1) {
        pIVar8->channel = 0xff;
        pIVar8 = pIVar8 + 1;
        pIVar12 = pIVar12 + 1;
      }
      iVar1 = (int)(((long)pIVar12 - (long)pattern->entry) / 7);
      pattern->n_entries = iVar1;
      iVar1 = -(uint)(iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

static int it_riff_am_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len, int ver )
{
    int nrows, row;
    long start, end;
	unsigned flags;
    int p, q, r;
	IT_ENTRY * entry;

    nrows = dumbfile_getc( f ) + 1;

	pattern->n_rows = nrows;

	len -= 1;

	pattern->n_entries = 0;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < nrows) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xE0;

        if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 2 );
            if (flags & 0x40) dumbfile_skip( f, 2 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
		}
	}

	if ( ! pattern->n_entries ) return 0;

	pattern->n_entries += nrows;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    dumbfile_seek( f, start, DFS_SEEK_SET );

    while ( ( row < nrows ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );

        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x1F;
		entry->mask = 0;

		if (flags & 0xE0)
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( r, q, entry, 0 );
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
                if ( r )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = r - 1;
				}
			}

			if ( flags & 0x20 )
			{
                q = dumbfile_getc( f );
				entry->mask |= IT_ENTRY_VOLPAN;
                if ( ver == 0 ) entry->volpan = q;
                else entry->volpan = q * 64 / 127;
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < nrows )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}